

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_vocab.c
# Opt level: O1

HashVocab HashVocab_init_from_bin(char *mem)

{
  size_t sVar1;
  size_t sVar2;
  HashVocab pHVar3;
  ProbingVocabularyEntry_T *pPVar4;
  
  pHVar3 = (HashVocab)malloc(0x48);
  sVar1 = *(size_t *)mem;
  pHVar3->bound_ = sVar1;
  sVar2 = *(size_t *)(mem + 8);
  (pHVar3->tb).buckets_ = sVar2;
  if (sVar1 == 0) {
    __assert_fail("voc->bound_ != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/hash_vocab.c"
                  ,0x47,"HashVocab HashVocab_init_from_bin(const char *)");
  }
  if (sVar2 != 0) {
    (pHVar3->tb).begin_ = (ProbingVocabularyEntry_T *)(mem + 0x10);
    pPVar4 = (ProbingVocabularyEntry_T *)(mem + sVar2 * 0x10 + 0x10);
    (pHVar3->tb).end_ = pPVar4;
    pHVar3->words = (uint32_t *)pPVar4;
    pHVar3->word_strs = (char *)((long)&pPVar4->key + sVar1 * 4);
    pHVar3->init_from_bin = 0xffffffffffffffff;
    return pHVar3;
  }
  __assert_fail("voc->tb.buckets_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/hash_vocab.c"
                ,0x48,"HashVocab HashVocab_init_from_bin(const char *)");
}

Assistant:

HashVocab HashVocab_init_from_bin(const char* mem){
    //init_unknown_hash();
    HashVocab voc = malloc(sizeof(struct HashVocab_T));
#define READ(ret, typ, ptr) ret =*(typ *)ptr;\
                            ptr+=sizeof(typ);
    READ(voc->bound_ , size_t , mem)
    READ(voc->tb.buckets_ , size_t, mem)
    assert(voc->bound_ != 0);
    assert(voc->tb.buckets_ != 0);
    //printf("voc->bound_:%zu\n",voc->bound_ );
    //printf("voc->tb.buckets_:%zu\n", voc->tb.buckets_ );
    voc->tb.begin_ = (ProbingVocabularyEntry_T*)mem;
    voc->tb.end_ = voc->tb.begin_ + voc->tb.buckets_;
    mem = (char*)voc->tb.end_;
    voc->words = (uint32_t*)mem;
    mem = (char*)(voc->words + voc->bound_);
    voc->word_strs = (char*)mem;
    voc->init_from_bin = (size_t)-1;//init_from_bin is true
#undef READ
    return voc;
}